

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  TypeInfo *pTVar5;
  int iVar6;
  bool bVar7;
  CppType CVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  FieldDescriptor *this_00;
  DynamicMessage *pDVar13;
  int i;
  long i_00;
  RepeatedField<double> *this_01;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_0042c030;
  pDVar2 = this->type_info_->type;
  internal::
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::~InternalMetadataWithArenaBase
            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)this->type_info_->internal_metadata_offset));
  lVar12 = (long)this->type_info_->extensions_offset;
  if (lVar12 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar12));
  }
  lVar12 = 0;
  i_00 = 0;
  do {
    lVar11 = (long)*(int *)(pDVar2 + 0x2c);
    if (lVar11 <= i_00) {
      return;
    }
    lVar3 = *(long *)(pDVar2 + 0x30);
    this_00 = (FieldDescriptor *)(lVar3 + lVar12);
    lVar4 = *(long *)(lVar3 + 0x60 + lVar12);
    pTVar5 = this->type_info_;
    if (lVar4 == 0) {
      puVar9 = internal::scoped_array<unsigned_int>::operator[](&pTVar5->offsets,i_00);
      this_01 = (RepeatedField<double> *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)(int)*puVar9);
      if (*(int *)(lVar3 + 0x4c + lVar12) == 3) {
        CVar8 = FieldDescriptor::cpp_type(this_00);
        switch(CVar8) {
        case CPPTYPE_INT32:
        case CPPTYPE_ENUM:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_01);
          break;
        case CPPTYPE_INT64:
          RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_01);
          break;
        case CPPTYPE_UINT32:
          RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_01);
          break;
        case CPPTYPE_UINT64:
          RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_01);
          break;
        case CPPTYPE_DOUBLE:
          RepeatedField<double>::~RepeatedField(this_01);
          break;
        case CPPTYPE_FLOAT:
          RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_01);
          break;
        case CPPTYPE_BOOL:
          RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_01);
          break;
        case CPPTYPE_STRING:
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)this_01);
          break;
        case CPPTYPE_MESSAGE:
          bVar7 = FieldDescriptor::is_map(this_00);
          if (bVar7) {
            (*(code *)**(undefined8 **)this_01)(this_01);
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_01);
          }
        }
      }
      else {
        CVar8 = FieldDescriptor::cpp_type(this_00);
        if (CVar8 == CPPTYPE_STRING) {
          pDVar13 = this->type_info_->prototype;
          puVar9 = internal::scoped_array<unsigned_int>::operator[](&this->type_info_->offsets,i_00)
          ;
          uVar10 = (ulong)(int)*puVar9;
          goto LAB_0030ec1e;
        }
        CVar8 = FieldDescriptor::cpp_type(this_00);
        if ((CVar8 == CPPTYPE_MESSAGE) &&
           (pDVar13 = this->type_info_->prototype,
           pDVar13 != (DynamicMessage *)0x0 && pDVar13 != this)) goto LAB_0030ec6c;
      }
    }
    else {
      iVar6 = (int)((lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x40)) / 0x30);
      if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(iVar6 * 4 + pTVar5->oneof_case_offset)) == *(int *)(lVar3 + 0x38 + lVar12))
      {
        puVar9 = internal::scoped_array<unsigned_int>::operator[](&pTVar5->offsets,lVar11 + iVar6);
        uVar1 = *puVar9;
        CVar8 = FieldDescriptor::cpp_type(this_00);
        this_01 = (RepeatedField<double> *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)uVar1);
        if (CVar8 == CPPTYPE_STRING) {
          pDVar13 = this->type_info_->prototype;
          puVar9 = internal::scoped_array<unsigned_int>::operator[](&this->type_info_->offsets,i_00)
          ;
          uVar10 = (ulong)*puVar9;
LAB_0030ec1e:
          internal::ArenaStringPtr::Destroy
                    ((ArenaStringPtr *)this_01,
                     *(string **)
                      ((long)&(pDVar13->super_Message).super_MessageLite._vptr_MessageLite + uVar10)
                     ,(Arena *)0x0);
        }
        else {
          CVar8 = FieldDescriptor::cpp_type(this_00);
          if (CVar8 == CPPTYPE_MESSAGE) {
LAB_0030ec6c:
            if (*(long **)this_01 != (long *)0x0) {
              (**(code **)(**(long **)this_01 + 8))();
            }
          }
        }
      }
    }
    i_00 = i_00 + 1;
    lVar12 = lVar12 + 0xa8;
  } while( true );
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<InternalMetadataWithArena*>(
      OffsetToPointer(type_info_->internal_metadata_offset))
      ->~InternalMetadataWithArena();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->containing_oneof()) {
      void* field_ptr = OffsetToPointer(
          type_info_->oneof_case_offset
          + sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) ==
          field->number()) {
        field_ptr = OffsetToPointer(type_info_->offsets[
            descriptor->field_count() + field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const ::std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(
                            type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const ::std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
              default_value, NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}